

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swapimpl.cpp
# Opt level: O2

int32_t unorm_swap(UDataSwapper *ds,void *inData,int32_t length,void *outData,UErrorCode *pErrorCode
                  )

{
  void *__src;
  byte bVar1;
  int32_t iVar2;
  int32_t iVar3;
  void *__dest;
  char *fmt;
  int iVar4;
  int iVar5;
  long lVar6;
  int32_t indexes [32];
  int local_b8 [11];
  int32_t local_8c;
  int local_88;
  
  iVar2 = udata_swapDataHeader_63(ds,inData,length,outData,pErrorCode);
  if (pErrorCode == (UErrorCode *)0x0) {
    return 0;
  }
  if (U_ZERO_ERROR < *pErrorCode) {
    return 0;
  }
  bVar1 = *(byte *)((long)inData + 0xd);
  if ((((bVar1 != 0x6f || *(byte *)((long)inData + 0xc) != 0x4e) ||
       (bVar1 = 0x6f, *(char *)((long)inData + 0xe) != 'r')) ||
      (*(char *)((long)inData + 0xf) != 'm')) || (*(char *)((long)inData + 0x10) != '\x02')) {
    udata_printError_63(ds,
                        "unorm_swap(): data format %02x.%02x.%02x.%02x (format version %02x) is not recognized as unorm.icu\n"
                        ,(ulong)*(byte *)((long)inData + 0xc),(ulong)bVar1,
                        (ulong)*(byte *)((long)inData + 0xe),(ulong)*(byte *)((long)inData + 0xf),
                        (uint)*(byte *)((long)inData + 0x10));
    *pErrorCode = U_UNSUPPORTED_ERROR;
    return 0;
  }
  if ((length < 0) || (length = length - iVar2, 0x7f < length)) {
    __src = (void *)((long)inData + (long)iVar2);
    __dest = (void *)((long)iVar2 + (long)outData);
    for (lVar6 = 0; lVar6 != 0x20; lVar6 = lVar6 + 1) {
      iVar3 = udata_readInt32_63(ds,*(int32_t *)((long)__src + lVar6 * 4));
      local_b8[lVar6] = iVar3;
    }
    lVar6 = (long)local_b8[0] + 0x80;
    iVar5 = local_b8[10] + local_8c + (int)lVar6 + (local_b8[2] + local_b8[1]) * 2 + local_88 * 2;
    if (-1 < length) {
      if (length < iVar5) {
        fmt = "unorm_swap(): too few bytes (%d after header) for all of unorm.icu\n";
        goto LAB_001f72fa;
      }
      iVar4 = (local_b8[2] + local_b8[1]) * 2;
      if (inData != outData) {
        memcpy(__dest,__src,(long)iVar5);
      }
      (*ds->swapArray32)(ds,__src,0x80,__dest,pErrorCode);
      utrie_swap_63(ds,(void *)((long)__src + 0x80),local_b8[0],(void *)((long)__dest + 0x80),
                    pErrorCode);
      (*ds->swapArray16)(ds,(void *)(lVar6 + (long)__src),iVar4,(void *)(lVar6 + (long)__dest),
                         pErrorCode);
      iVar4 = (int)lVar6 + iVar4;
      if (local_b8[10] != 0) {
        utrie_swap_63(ds,(void *)((long)iVar4 + (long)__src),local_b8[10],
                      (void *)((long)iVar4 + (long)__dest),pErrorCode);
        iVar4 = iVar4 + local_b8[10];
      }
      if (local_8c != 0) {
        utrie_swap_63(ds,(void *)((long)iVar4 + (long)__src),local_8c,
                      (void *)((long)iVar4 + (long)__dest),pErrorCode);
        iVar4 = iVar4 + local_8c;
      }
      (*ds->swapArray16)(ds,(void *)((long)__src + (long)iVar4),local_88 * 2,
                         (void *)((long)__dest + (long)iVar4),pErrorCode);
    }
    iVar2 = iVar5 + iVar2;
  }
  else {
    fmt = "unorm_swap(): too few bytes (%d after header) for unorm.icu\n";
LAB_001f72fa:
    iVar2 = 0;
    udata_printError_63(ds,fmt,(ulong)(uint)length);
    *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
  }
  return iVar2;
}

Assistant:

static int32_t U_CALLCONV
unorm_swap(const UDataSwapper *ds,
           const void *inData, int32_t length, void *outData,
           UErrorCode *pErrorCode) {
    const UDataInfo *pInfo;
    int32_t headerSize;

    const uint8_t *inBytes;
    uint8_t *outBytes;

    const int32_t *inIndexes;
    int32_t indexes[32];

    int32_t i, offset, count, size;

    /* udata_swapDataHeader checks the arguments */
    headerSize=udata_swapDataHeader(ds, inData, length, outData, pErrorCode);
    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return 0;
    }

    /* check data format and format version */
    pInfo=(const UDataInfo *)((const char *)inData+4);
    if(!(
        pInfo->dataFormat[0]==0x4e &&   /* dataFormat="Norm" */
        pInfo->dataFormat[1]==0x6f &&
        pInfo->dataFormat[2]==0x72 &&
        pInfo->dataFormat[3]==0x6d &&
        pInfo->formatVersion[0]==2
    )) {
        udata_printError(ds, "unorm_swap(): data format %02x.%02x.%02x.%02x (format version %02x) is not recognized as unorm.icu\n",
                         pInfo->dataFormat[0], pInfo->dataFormat[1],
                         pInfo->dataFormat[2], pInfo->dataFormat[3],
                         pInfo->formatVersion[0]);
        *pErrorCode=U_UNSUPPORTED_ERROR;
        return 0;
    }

    inBytes=(const uint8_t *)inData+headerSize;
    outBytes=(uint8_t *)outData+headerSize;

    inIndexes=(const int32_t *)inBytes;

    if(length>=0) {
        length-=headerSize;
        if(length<32*4) {
            udata_printError(ds, "unorm_swap(): too few bytes (%d after header) for unorm.icu\n",
                             length);
            *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
            return 0;
        }
    }

    /* read the first 32 indexes (ICU 2.8/format version 2.2: _NORM_INDEX_TOP==32, might grow) */
    for(i=0; i<32; ++i) {
        indexes[i]=udata_readInt32(ds, inIndexes[i]);
    }

    /* calculate the total length of the data */
    size=
        32*4+ /* size of indexes[] */
        indexes[_NORM_INDEX_TRIE_SIZE]+
        indexes[_NORM_INDEX_UCHAR_COUNT]*2+
        indexes[_NORM_INDEX_COMBINE_DATA_COUNT]*2+
        indexes[_NORM_INDEX_FCD_TRIE_SIZE]+
        indexes[_NORM_INDEX_AUX_TRIE_SIZE]+
        indexes[_NORM_INDEX_CANON_SET_COUNT]*2;

    if(length>=0) {
        if(length<size) {
            udata_printError(ds, "unorm_swap(): too few bytes (%d after header) for all of unorm.icu\n",
                             length);
            *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
            return 0;
        }

        /* copy the data for inaccessible bytes */
        if(inBytes!=outBytes) {
            uprv_memcpy(outBytes, inBytes, size);
        }

        offset=0;

        /* swap the indexes[] */
        count=32*4;
        ds->swapArray32(ds, inBytes, count, outBytes, pErrorCode);
        offset+=count;

        /* swap the main UTrie */
        count=indexes[_NORM_INDEX_TRIE_SIZE];
        utrie_swap(ds, inBytes+offset, count, outBytes+offset, pErrorCode);
        offset+=count;

        /* swap the uint16_t extraData[] and the uint16_t combiningTable[] */
        count=(indexes[_NORM_INDEX_UCHAR_COUNT]+indexes[_NORM_INDEX_COMBINE_DATA_COUNT])*2;
        ds->swapArray16(ds, inBytes+offset, count, outBytes+offset, pErrorCode);
        offset+=count;

        /* swap the FCD UTrie */
        count=indexes[_NORM_INDEX_FCD_TRIE_SIZE];
        if(count!=0) {
            utrie_swap(ds, inBytes+offset, count, outBytes+offset, pErrorCode);
            offset+=count;
        }

        /* swap the aux UTrie */
        count=indexes[_NORM_INDEX_AUX_TRIE_SIZE];
        if(count!=0) {
            utrie_swap(ds, inBytes+offset, count, outBytes+offset, pErrorCode);
            offset+=count;
        }

        /* swap the uint16_t combiningTable[] */
        count=indexes[_NORM_INDEX_CANON_SET_COUNT]*2;
        ds->swapArray16(ds, inBytes+offset, count, outBytes+offset, pErrorCode);
        offset+=count;
    }

    return headerSize+size;
}